

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_electronVolt_Test::TestBody(unitStrings_electronVolt_Test *this)

{
  bool bVar1;
  precise_unit *ppVar2;
  char *pcVar3;
  uint64_t in_RCX;
  string *psVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  precise_unit pVar6;
  AssertHelper local_3a0;
  Message local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_10;
  string local_370;
  AssertHelper local_350;
  Message local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_9;
  precise_unit local_320;
  string local_310;
  AssertHelper local_2f0;
  Message local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_8;
  precise_unit local_2c0;
  undefined1 local_2b0 [8];
  string str;
  Message local_288;
  precise_unit local_280;
  string local_270;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_7;
  Message local_238;
  precise_unit local_230;
  string local_220;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_6;
  Message local_1e8;
  precise_unit local_1e0;
  string local_1d0;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_5;
  Message local_198;
  precise_unit local_190;
  string local_180;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_4;
  Message local_148;
  precise_unit local_140;
  string local_130;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_3;
  Message local_f8;
  precise_unit local_f0;
  string local_e0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  precise_unit local_a0;
  string local_90;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58 [3];
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  unitStrings_electronVolt_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_40;
  units::to_string_abi_cxx11_(psVar4,(units *)units::precise::energy::eV,ppVar2,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_20,"to_string(precise::energy::eV)","\"eV\"",psVar4,
             (char (*) [3])0x27f190);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    psVar4 = (string *)0x188;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x188,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_a0 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::nano,
                        (precise_unit *)units::precise::energy::eV);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_90;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_a0,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_70,"to_string(precise::nano * precise::energy::eV)","\"neV\"",psVar5,
             (char (*) [4])"neV");
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    psVar5 = (string *)0x189;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x189,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  local_f0 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::micro,
                        (precise_unit *)units::precise::energy::eV);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_e0;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_f0,ppVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_c0,"to_string(precise::micro * precise::energy::eV)","\"ueV\"",psVar4
             ,(char (*) [4])0x27f183);
  std::__cxx11::string::~string((string *)&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    psVar4 = (string *)0x18a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x18a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_140 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::milli,
                         (precise_unit *)units::precise::energy::eV);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_130;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_140,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_110,"to_string(precise::milli * precise::energy::eV)","\"meV\"",
             psVar5,(char (*) [4])0x27f175);
  std::__cxx11::string::~string((string *)&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    psVar5 = (string *)0x18b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x18b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_190 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::kilo,
                         (precise_unit *)units::precise::energy::eV);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_180;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_190,ppVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_160,"to_string(precise::kilo * precise::energy::eV)","\"keV\"",psVar4
             ,(char (*) [4])"keV");
  std::__cxx11::string::~string((string *)&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    psVar4 = (string *)0x18c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x18c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  local_1e0 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::mega,
                         (precise_unit *)units::precise::energy::eV);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_1d0;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_1e0,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_1b0,"to_string(precise::mega * precise::energy::eV)","\"MeV\"",psVar5
             ,(char (*) [4])"MeV");
  std::__cxx11::string::~string((string *)&local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    psVar5 = (string *)0x18d;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x18d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_230 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::giga,
                         (precise_unit *)units::precise::energy::eV);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = &local_220;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_230,ppVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_200,"to_string(precise::giga * precise::energy::eV)","\"GeV\"",psVar4
             ,(char (*) [4])"GeV");
  std::__cxx11::string::~string((string *)&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    psVar4 = (string *)0x18e;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x18e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  local_280 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::tera,
                         (precise_unit *)units::precise::energy::eV);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_270;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_280,ppVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_250,"to_string(precise::tera * precise::energy::eV)","\"TeV\"",psVar5
             ,(char (*) [4])"TeV");
  std::__cxx11::string::~string((string *)&local_270);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    psVar5 = (string *)0x18f;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&str.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,399,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&str.field_2 + 8),&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&str.field_2 + 8));
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  join_0x00000000_0x00001200_ =
       units::precise_unit::operator*
                 ((precise_unit *)units::precise::milli,(precise_unit *)units::precise::energy::eV);
  local_2c0 = units::precise_unit::operator/
                        ((precise_unit *)units::precise::count,(precise_unit *)&gtest_ar_8.message_)
  ;
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  psVar4 = (string *)local_2b0;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_2c0,ppVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
            ((EqHelper *)local_2e0,"str","\"count/meV\"",psVar4,(char (*) [10])"count/meV");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    psVar4 = (string *)0x193;
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x193,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  pVar6 = units::precise_unit::operator*
                    ((precise_unit *)units::precise::micro,
                     (precise_unit *)units::precise::energy::eV);
  gtest_ar_9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pVar6.multiplier_;
  local_320 = units::precise_unit::operator/
                        ((precise_unit *)units::precise::one,(precise_unit *)&gtest_ar_9.message_);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_310,(units *)&local_320,ppVar2,(uint64_t)psVar4);
  lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0;
  std::__cxx11::string::operator=((string *)lhs,(string *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_340,"str","\"1/ueV\"",lhs,(char (*) [6])"1/ueV");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x196;
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x196,pcVar3);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  pVar6 = units::precise_unit::operator/
                    ((precise_unit *)units::precise::m,(precise_unit *)units::precise::energy::eV);
  gtest_ar_10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pVar6.multiplier_;
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_370,(units *)&gtest_ar_10.message_,ppVar2,(uint64_t)lhs);
  std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_390,"str","\"m/eV\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
             (char (*) [5])"m/eV");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x199,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  std::__cxx11::string::~string((string *)local_2b0);
  return;
}

Assistant:

TEST(unitStrings, electronVolt)
{
    EXPECT_EQ(to_string(precise::energy::eV), "eV");
    EXPECT_EQ(to_string(precise::nano * precise::energy::eV), "neV");
    EXPECT_EQ(to_string(precise::micro * precise::energy::eV), "ueV");
    EXPECT_EQ(to_string(precise::milli * precise::energy::eV), "meV");
    EXPECT_EQ(to_string(precise::kilo * precise::energy::eV), "keV");
    EXPECT_EQ(to_string(precise::mega * precise::energy::eV), "MeV");
    EXPECT_EQ(to_string(precise::giga * precise::energy::eV), "GeV");
    EXPECT_EQ(to_string(precise::tera * precise::energy::eV), "TeV");

    auto str =
        to_string(precise::count / (precise::milli * precise::energy::eV));
    EXPECT_EQ(str, "count/meV");

    str = to_string(precise::one / (precise::micro * precise::energy::eV));
    EXPECT_EQ(str, "1/ueV");

    str = to_string(precise::m / precise::energy::eV);
    EXPECT_EQ(str, "m/eV");
}